

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseIntegerArrayProperty
               (vector<int,_std::allocator<int>_> *ret,string *err,json *o,string *property,
               bool required,string *parent_node)

{
  primitive_iterator_t *__lhs;
  bool bVar1;
  char *member;
  ulong uVar2;
  json *pjVar3;
  reference o_00;
  string local_1d8 [32];
  string local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [35];
  undefined1 local_175;
  int local_174;
  undefined1 local_170 [3];
  bool isNumber;
  int numberValue;
  json_const_array_iterator i;
  json_const_array_iterator end;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  string local_d0 [48];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  undefined1 local_60 [8];
  json_const_iterator it;
  string *parent_node_local;
  bool required_local;
  string *property_local;
  json *o_local;
  string *err_local;
  vector<int,_std::allocator<int>_> *ret_local;
  
  it.m_it.primitive_iterator.m_it = (difference_type)parent_node;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_60);
  member = (char *)std::__cxx11::string::c_str();
  bVar1 = detail::FindMember(o,member,(json_const_iterator *)local_60);
  if (bVar1) {
    pjVar3 = detail::GetValue((json_const_iterator *)local_60);
    bVar1 = detail::IsArray(pjVar3);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::clear(ret);
      pjVar3 = detail::GetValue((json_const_iterator *)local_60);
      detail::ArrayEnd((json_const_array_iterator *)&i.m_it.primitive_iterator,pjVar3);
      pjVar3 = detail::GetValue((json_const_iterator *)local_60);
      detail::ArrayBegin((json_const_array_iterator *)local_170,pjVar3);
      while (bVar1 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::
                     operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                               ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_170,
                                (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&i.m_it.primitive_iterator), bVar1) {
        o_00 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_170);
        local_175 = detail::GetInt(o_00,&local_174);
        if (!(bool)local_175) {
          if ((required) && (err != (string *)0x0)) {
            std::operator+((char *)local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x1bbf4b);
            std::operator+(local_198,(char *)local_1b8);
            std::__cxx11::string::operator+=((string *)err,(string *)local_198);
            std::__cxx11::string::~string((string *)local_198);
            std::__cxx11::string::~string(local_1b8);
            uVar2 = std::__cxx11::string::empty();
            if ((uVar2 & 1) == 0) {
              std::operator+((char *)local_1d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x1bbb98);
              std::__cxx11::string::operator+=((string *)err,local_1d8);
              std::__cxx11::string::~string(local_1d8);
            }
            std::__cxx11::string::operator+=((string *)err,".\n");
          }
          return false;
        }
        std::vector<int,_std::allocator<int>_>::push_back(ret,&local_174);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_170);
      }
      ret_local._7_1_ = true;
    }
    else {
      if ((required) && (err != (string *)0x0)) {
        std::operator+((char *)local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bbf4b
                      );
        std::operator+(local_f0,(char *)local_110);
        std::__cxx11::string::operator+=((string *)err,(string *)local_f0);
        std::__cxx11::string::~string((string *)local_f0);
        std::__cxx11::string::~string(local_110);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          __lhs = &end.m_it.primitive_iterator;
          std::operator+((char *)__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1bbb98);
          std::__cxx11::string::operator+=((string *)err,(string *)__lhs);
          std::__cxx11::string::~string((string *)&end.m_it.primitive_iterator);
        }
        std::__cxx11::string::operator+=((string *)err,".\n");
      }
      ret_local._7_1_ = false;
    }
  }
  else {
    if ((required) && (err != (string *)0x0)) {
      std::operator+((char *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bbf4b);
      std::operator+(local_80,(char *)local_a0);
      std::__cxx11::string::operator+=((string *)err,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string(local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+((char *)local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bbb98
                      );
        std::__cxx11::string::operator+=((string *)err,local_d0);
        std::__cxx11::string::~string(local_d0);
      }
      std::__cxx11::string::operator+=((string *)err,".\n");
    }
    ret_local._7_1_ = false;
  }
  return ret_local._7_1_;
}

Assistant:

static bool ParseIntegerArrayProperty(std::vector<int> *ret, std::string *err,
                                      const detail::json &o,
                                      const std::string &property,
                                      bool required,
                                      const std::string &parent_node = "") {
  detail::json_const_iterator it;
  if (!detail::FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  if (!detail::IsArray(detail::GetValue(it))) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not an array";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  ret->clear();
  auto end = detail::ArrayEnd(detail::GetValue(it));
  for (auto i = detail::ArrayBegin(detail::GetValue(it)); i != end; ++i) {
    int numberValue;
    bool isNumber = detail::GetInt(*i, numberValue);
    if (!isNumber) {
      if (required) {
        if (err) {
          (*err) += "'" + property + "' property is not an integer type.\n";
          if (!parent_node.empty()) {
            (*err) += " in " + parent_node;
          }
          (*err) += ".\n";
        }
      }
      return false;
    }
    ret->push_back(numberValue);
  }

  return true;
}